

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall cursespp::App::EnsureFocusIsValid(App *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  WindowState *pWVar2;
  IWindowPtr focused;
  IWindowPtr local_30;
  element_type *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  pWVar2 = &this->state;
  if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      == (element_type *)0x0) {
    pWVar2 = (WindowState *)&(this->state).layout;
  }
  peVar1 = (pWVar2->overlay).super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (pWVar2->overlay).super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar1 != (element_type *)0x0) {
    (*(peVar1->super_IWindowGroup)._vptr_IWindowGroup[10])(&local_20);
    if (local_20 !=
        (this->state).focused.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr) {
      local_30.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_20;
      local_30.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_18;
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_18->_M_use_count = local_18->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_18->_M_use_count = local_18->_M_use_count + 1;
        }
      }
      UpdateFocusedWindow(this,&local_30);
      if (local_30.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_30.super___shared_ptr<cursespp::IWindow,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      Window::InvalidateScreen();
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void App::EnsureFocusIsValid() {
    ILayoutPtr layout = this->state.ActiveLayout();
    if (layout) {
        IWindowPtr focused = layout->GetFocus();
        if (focused != this->state.focused) {
            this->UpdateFocusedWindow(focused);
            Window::InvalidateScreen();
        }
    }
}